

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas2_d.cpp
# Opt level: O2

void dgemv(char trans,int m,int n,double alpha,double *a,int lda,double *x,int incx,double beta,
          double *y,int incy)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  double dVar8;
  string local_78;
  double local_58;
  double local_50;
  long local_48;
  allocator<char> local_39;
  int local_38;
  int local_34;
  
  local_58 = alpha;
  local_50 = beta;
  local_34 = lda;
  bVar1 = lsame(trans,'N');
  if (((bVar1) || (bVar1 = lsame(trans,'T'), bVar1)) || (bVar1 = lsame(trans,'C'), bVar1)) {
    if (m < 0) {
      iVar2 = 2;
    }
    else if (n < 0) {
      iVar2 = 3;
    }
    else {
      iVar2 = i4_max(1,m);
      if (local_34 < iVar2) {
        iVar2 = 6;
      }
      else if (incx == 0) {
        iVar2 = 8;
      }
      else {
        if (incy != 0) {
          if (n == 0 || m == 0) {
            return;
          }
          if (((local_58 == 0.0) && (!NAN(local_58))) && ((local_50 == 1.0 && (!NAN(local_50))))) {
            return;
          }
          bVar1 = lsame(trans,'N');
          iVar2 = m;
          if (bVar1) {
            iVar2 = n;
          }
          uVar4 = (ulong)(uint)n;
          if (bVar1) {
            uVar4 = (ulong)(uint)m;
          }
          local_38 = (1 - iVar2) * incx;
          if (0 < incx) {
            local_38 = 0;
          }
          iVar2 = (1 - (int)uVar4) * incy;
          if (0 < incy) {
            iVar2 = 0;
          }
          local_48 = (long)incy;
          if ((local_50 != 1.0) || (NAN(local_50))) {
            if (incy == 1) {
              if ((local_50 != 0.0) || (NAN(local_50))) {
                for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
                  y[uVar5] = y[uVar5] * local_50;
                }
              }
              else {
                for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
                  y[uVar5] = 0.0;
                }
              }
            }
            else {
              pdVar6 = y + iVar2;
              if ((local_50 != 0.0) || (NAN(local_50))) {
                while (iVar3 = (int)uVar4, uVar4 = (ulong)(iVar3 - 1), iVar3 != 0) {
                  *pdVar6 = *pdVar6 * local_50;
                  pdVar6 = pdVar6 + local_48;
                }
              }
              else {
                while (iVar3 = (int)uVar4, uVar4 = (ulong)(iVar3 - 1), iVar3 != 0) {
                  *pdVar6 = 0.0;
                  pdVar6 = pdVar6 + local_48;
                }
              }
            }
          }
          local_50 = (double)CONCAT44(local_50._4_4_,iVar2);
          if ((local_58 == 0.0) && (!NAN(local_58))) {
            return;
          }
          bVar1 = lsame(trans,'N');
          if (!bVar1) {
            if (incx != 1) {
              lVar7 = (long)local_50._0_4_;
              for (uVar4 = 0; uVar4 != (uint)n; uVar4 = uVar4 + 1) {
                dVar8 = 0.0;
                pdVar6 = x + local_38;
                for (uVar5 = 0; (uint)m != uVar5; uVar5 = uVar5 + 1) {
                  dVar8 = dVar8 + a[uVar5] * *pdVar6;
                  pdVar6 = pdVar6 + incx;
                }
                y[lVar7] = dVar8 * local_58 + y[lVar7];
                lVar7 = lVar7 + local_48;
                a = a + local_34;
              }
              return;
            }
            lVar7 = (long)local_50._0_4_;
            for (uVar4 = 0; uVar4 != (uint)n; uVar4 = uVar4 + 1) {
              dVar8 = 0.0;
              for (uVar5 = 0; (uint)m != uVar5; uVar5 = uVar5 + 1) {
                dVar8 = dVar8 + a[uVar5] * x[uVar5];
              }
              y[lVar7] = dVar8 * local_58 + y[lVar7];
              lVar7 = lVar7 + local_48;
              a = a + local_34;
            }
            return;
          }
          if (incy != 1) {
            lVar7 = (long)local_38;
            for (uVar4 = 0; uVar4 != (uint)n; uVar4 = uVar4 + 1) {
              dVar8 = x[lVar7];
              if ((dVar8 != 0.0) || (NAN(dVar8))) {
                pdVar6 = y + local_50._0_4_;
                for (uVar5 = 0; (uint)m != uVar5; uVar5 = uVar5 + 1) {
                  *pdVar6 = a[uVar5] * dVar8 * local_58 + *pdVar6;
                  pdVar6 = pdVar6 + local_48;
                }
              }
              lVar7 = lVar7 + incx;
              a = a + local_34;
            }
            return;
          }
          lVar7 = (long)local_38;
          for (uVar4 = 0; uVar4 != (uint)n; uVar4 = uVar4 + 1) {
            dVar8 = x[lVar7];
            if ((dVar8 != 0.0) || (NAN(dVar8))) {
              for (uVar5 = 0; (uint)m != uVar5; uVar5 = uVar5 + 1) {
                y[uVar5] = a[uVar5] * dVar8 * local_58 + y[uVar5];
              }
            }
            lVar7 = lVar7 + incx;
            a = a + local_34;
          }
          return;
        }
        iVar2 = 0xb;
      }
    }
  }
  else {
    iVar2 = 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"DGEMV",&local_39);
  xerbla(&local_78,iVar2);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void dgemv ( char trans, int m, int n, double alpha, double a[], int lda, 
  double x[], int incx, double beta, double y[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    DGEMV computes y := alpha * A * x + beta * y for general matrix A.
//
//  Discussion:
//
//    DGEMV performs one of the matrix-vector operations
//      y := alpha*A *x + beta*y
//    or
//      y := alpha*A'*x + beta*y,
//    where alpha and beta are scalars, x and y are vectors and A is an
//    m by n matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 April 2014
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Parameters:
//
//    Input, char TRANS, specifies the operation to be performed:
//    'n' or 'N'   y := alpha*A *x + beta*y.
//    't' or 'T'   y := alpha*A'*x + beta*y.
//    'c' or 'C'   y := alpha*A'*x + beta*y.
//
//    Input, int M, the number of rows of the matrix A.
//    0 <= M.
//
//    Input, int N, the number of columns of the matrix A.
//    0 <= N.
//
//    Input, double ALPHA, the scalar multiplier for A * x.
//
//    Input, double A[LDA*N].  The M x N subarray contains
//    the matrix A.
//
//    Input, int LDA, the the first dimension of A as declared
//    in the calling routine.  max ( 1, M ) <= LDA.
//
//    Input, double X[*], an array containing the vector to be 
//    multiplied by the matrix A.  
//    If TRANS = 'N' or 'n', then X must contain N entries, stored in INCX 
//    increments in a space of at least ( 1 + ( N - 1 ) * abs ( INCX ) ) 
//    locations.
//    Otherwise, X must contain M entries, store in INCX increments
//    in a space of at least ( 1 + ( M - 1 ) * abs ( INCX ) ) locations.
//
//    Input, int INCX, the increment for the elements of
//    X.  INCX must not be zero.
//
//    Input, double BETA, the scalar multiplier for Y.
//
//    Input/output, double Y[*], an array containing the vector to
//    be scaled and incremented by A*X.
//    If TRANS = 'N' or 'n', then Y must contain M entries, stored in INCY
//    increments in a space of at least ( 1 + ( M - 1 ) * abs ( INCY ) ) 
//    locations.
//    Otherwise, Y must contain N entries, store in INCY increments
//    in a space of at least ( 1 + ( N - 1 ) * abs ( INCY ) ) locations.
//
//    Input, int INCY, the increment for the elements of
//    Y.  INCY must not be zero.
//
{
  int i;
  int info;
  int ix;
  int iy;
  int j;
  int jx;
  int jy;
  int kx;
  int ky;
  int lenx;
  int leny;
  double temp;
//
//  Test the input parameters.
//
  info = 0;
  if ( ! lsame ( trans, 'N' ) &&
       ! lsame ( trans, 'T' ) &&
       ! lsame ( trans, 'C' ) ) 
  {
    info = 1;
  }
  else if ( m < 0 )
  {
    info = 2;
  }
  else if ( n < 0 )
  {
    info = 3;
  }
  else if ( lda < i4_max ( 1, m ) )
  {
    info = 6;
  }
  else if ( incx == 0 )
  {
    info = 8;
  }
  else if ( incy == 0 )
  {
    info = 11;
  }

  if ( info != 0 )
  {
    xerbla ( "DGEMV", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( ( m == 0 ) ||
       ( n == 0 ) ||
       ( ( alpha == 0.0 ) && ( beta == 1.0 ) ) )
 {
   return;
  }
//
//  Set LENX and LENY, the lengths of the vectors x and y, and set
//  up the start points in X and Y.
//
  if ( lsame ( trans, 'N' ) )
  {
    lenx = n;
    leny = m;
  }
  else
  {
    lenx = m;
    leny = n;
  }

  if ( 0 < incx )
  {
    kx = 0;
  }
  else
  {
    kx = 0 - ( lenx - 1 ) * incx;
  }

  if ( 0 < incy )
  {
    ky = 0;
  }
  else
  {
    ky = 0 - ( leny - 1 ) * incy;
  }
//
//  Start the operations. In this version the elements of A are
//  accessed sequentially with one pass through A.
//
//  First form  y := beta*y.
//
  if ( beta != 1.0 )
  {
    if ( incy == 1 )
    {
      if ( beta == 0.0 )
      {
        for ( i = 0; i < leny; i++ )
        {
          y[i] = 0.0;
        }
      }
      else
      {
        for ( i = 0; i < leny; i++ )
        {
          y[i] = beta * y[i];
        }
      }
    }
    else
    {
      iy = ky;
      if ( beta == 0.0 )
      {
        for ( i = 0; i < leny; i++ )
        {
          y[iy] = 0.0;
          iy = iy + incy;
        }
      }
      else
      {
        for ( i = 0; i < leny; i++ )
        {
          y[iy] = beta * y[iy];
          iy = iy + incy;
        }
      }
    }
  }

  if ( alpha == 0.0 )
  {
    return;
  }
//
//  Form y := alpha*A*x + y.
//
  if ( lsame ( trans, 'N' ) )
  {
    jx = kx;
    if ( incy == 1 )
    {
      for ( j = 0; j < n; j++ )
      {
        if ( x[jx] != 0.0 )
        {
          temp = alpha * x[jx];
          for ( i = 0; i < m; i++ )
          {
            y[i] = y[i] + temp * a[i+j*lda];
          }
        }
        jx = jx + incx;
      }
    }
    else
    {
      for ( j = 0; j < n; j++ )
      {
        if ( x[jx] != 0.0 )
        {
          temp = alpha * x[jx];
          iy = ky;
          for ( i = 0; i < m; i++ )
          {
            y[iy] = y[iy] + temp * a[i+j*lda];
            iy = iy + incy;
          }
        }
        jx = jx + incx;
      }
    }
  }
/*
  Form y := alpha*A'*x + y.
*/
  else
  {
    jy = ky;
    if ( incx == 1 )
    {
      for ( j = 0; j < n; j++ )
      {
        temp = 0.0;
        for ( i = 0; i < m; i++ )
        {
          temp = temp + a[i+j*lda] * x[i];
        }
        y[jy] = y[jy] + alpha * temp;
        jy = jy + incy;
      }
    }
    else
    {
      for ( j = 0; j < n; j++ )
      {
        temp = 0.0;
        ix = kx;
        for ( i = 0; i < m; i++ )
        {
          temp = temp + a[i+j*lda] * x[ix];
          ix = ix + incx;
        }
        y[jy] = y[jy] + alpha * temp;
        jy = jy + incy;
      }
    }
  }

  return;
}